

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int Cudd_EpdCountMinterm(DdManager *manager,DdNode *node,int nvars,EpDouble *epd)

{
  int iVar1;
  st__table *table_00;
  int status;
  st__table *table;
  EpDouble tmp;
  EpDouble max;
  EpDouble *epd_local;
  int nvars_local;
  DdNode *node_local;
  DdManager *manager_local;
  
  background = manager->background;
  zero = (DdNode *)((ulong)manager->one ^ 1);
  EpdPow2(nvars,(EpDouble *)&tmp.exponent);
  table_00 = st__init_table(EpdCmp,st__ptrhash);
  if (table_00 == (st__table *)0x0) {
    EpdMakeZero(epd,0);
    manager_local._4_4_ = -1;
  }
  else {
    iVar1 = ddEpdCountMintermAux
                      ((DdNode *)((ulong)node & 0xfffffffffffffffe),(EpDouble *)&tmp.exponent,epd,
                       table_00);
    st__foreach(table_00,ddEpdFree,(char *)0x0);
    st__free_table(table_00);
    if (iVar1 == -1) {
      EpdMakeZero(epd,0);
      manager_local._4_4_ = -1;
    }
    else {
      if (((ulong)node & 1) != 0) {
        EpdSubtract3((EpDouble *)&tmp.exponent,epd,(EpDouble *)&table);
        EpdCopy((EpDouble *)&table,epd);
      }
      manager_local._4_4_ = 0;
    }
  }
  return manager_local._4_4_;
}

Assistant:

int
Cudd_EpdCountMinterm(
  DdManager * manager,
  DdNode * node,
  int  nvars,
  EpDouble * epd)
{
    EpDouble    max, tmp;
    st__table    *table;
    int         status;

    background = manager->background;
    zero = Cudd_Not(manager->one);

    EpdPow2(nvars, &max);
    table = st__init_table(EpdCmp, st__ptrhash);
    if (table == NULL) {
        EpdMakeZero(epd, 0);
        return(CUDD_OUT_OF_MEM);
    }
    status = ddEpdCountMintermAux(Cudd_Regular(node),&max,epd,table);
    st__foreach(table, ddEpdFree, NULL);
    st__free_table(table);
    if (status == CUDD_OUT_OF_MEM) {
        EpdMakeZero(epd, 0);
        return(CUDD_OUT_OF_MEM);
    }
    if (Cudd_IsComplement(node)) {
        EpdSubtract3(&max, epd, &tmp);
        EpdCopy(&tmp, epd);
    }
    return(0);

}